

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int resolveExprStep(Walker *pWalker,Expr *pExpr)

{
  byte *pbVar1;
  yColCache *pyVar2;
  ushort uVar3;
  Parse *pParse;
  Select *pSVar4;
  sqlite3 *psVar5;
  Db *pDVar6;
  SrcList *pSVar7;
  Table *pTVar8;
  IdList *pIVar9;
  ExprList *pEList;
  _func_void_sqlite3_context_ptr *p_Var10;
  bool bVar11;
  bool bVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Expr *pEVar17;
  FuncDef *pFVar18;
  byte bVar19;
  u8 uVar20;
  long lVar21;
  long lVar22;
  NameContext *pNC;
  char *zRight;
  char *pcVar23;
  char *pcVar24;
  int iVar25;
  Schema *pSVar26;
  ulong uVar27;
  Table **ppTVar28;
  uint uVar29;
  Column *pCVar30;
  char *pcVar31;
  Table **ppTVar32;
  SrcList_item *pSVar33;
  Schema *pSchema;
  Expr **ppEVar34;
  char **ppcVar35;
  NameContext *pNVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  SrcList_item *local_e0;
  NameContext *local_c0;
  int local_98;
  SrcList *local_70;
  undefined8 local_68;
  Walker w;
  
  pNC = (pWalker->u).pNC;
  pParse = pNC->pParse;
  bVar19 = pExpr->op;
  uVar37 = (uint)bVar19;
  uVar27 = (ulong)(uVar37 - 0x14);
  if (0x3e < uVar37 - 0x14) {
LAB_00255dfc:
    if (uVar37 == 0x77) {
LAB_00255e60:
      if ((pExpr->flags & 0x800) != 0) {
        iVar13 = pNC->nRef;
        notValid(pParse,pNC,"subqueries",0x26);
        sqlite3WalkSelect(pWalker,(pExpr->x).pSelect);
        if (iVar13 != pNC->nRef) {
          *(byte *)&pExpr->flags = (byte)pExpr->flags | 0x20;
          *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 0x40;
        }
      }
      goto LAB_00255ef2;
    }
    if (uVar37 != 0x97) {
      if (uVar37 == 0x87) {
        notValid(pParse,pNC,"parameters",0x26);
        goto LAB_00255ef2;
      }
      if (uVar37 != 0x94) {
        if (uVar37 == 0x7a) {
          notValid(pParse,pNC,"the \".\" operator",0x20);
          pEVar17 = pExpr->pRight;
          pcVar24 = (pExpr->pLeft->u).zToken;
          if (pEVar17->op == '\x1b') {
            zRight = (char *)0x0;
            pcVar31 = pcVar24;
          }
          else {
            ppEVar34 = &pEVar17->pLeft;
            pEVar17 = pEVar17->pRight;
            pcVar31 = ((*ppEVar34)->u).zToken;
            zRight = pcVar24;
          }
LAB_00255f50:
          pcVar24 = (pEVar17->u).zToken;
          psVar5 = pParse->db;
          pExpr->iTable = -1;
          pExpr->pTab = (Table *)0x0;
          pSchema = (Schema *)0x0;
          if ((zRight == (char *)0x0) || ((pNC->ncFlags & 6) != 0)) {
            zRight = (char *)0x0;
          }
          else {
            pSVar26 = (Schema *)(ulong)(uint)psVar5->nDb;
            if (psVar5->nDb < 1) {
              pSVar26 = pSchema;
            }
            lVar22 = 0;
            do {
              lVar21 = lVar22;
              if ((long)pSVar26 * 0x20 + 0x20 == lVar21 + 0x20) goto LAB_00255fd1;
              pDVar6 = psVar5->aDb;
              iVar13 = sqlite3StrICmp(*(char **)((long)&pDVar6->zDbSName + lVar21),zRight);
              lVar22 = lVar21 + 0x20;
            } while (iVar13 != 0);
            pSchema = *(Schema **)((long)&pDVar6->pSchema + lVar21);
          }
LAB_00255fd1:
          ppTVar32 = &pParse->pTriggerTab;
          local_98 = 0;
          local_e0 = (SrcList_item *)0x0;
          bVar12 = false;
          iVar13 = 0;
          local_c0 = pNC;
          do {
            pSVar7 = local_c0->pSrcList;
            if (pSVar7 == (SrcList *)0x0) {
              iVar14 = 0;
            }
            else {
              iVar16 = pSVar7->nSrc;
              pSVar33 = pSVar7->a;
              iVar14 = 0;
              if (iVar16 < 1) {
                iVar16 = 0;
              }
              for (iVar25 = 0; iVar25 != iVar16; iVar25 = iVar25 + 1) {
                pTVar8 = pSVar33->pTab;
                pSVar4 = pSVar33->pSelect;
                if ((pSVar4 == (Select *)0x0) || ((pSVar4->selFlags & 0x800) == 0)) {
LAB_00256116:
                  if ((zRight == (char *)0x0) || (pTVar8->pSchema == pSchema)) {
                    if (pcVar31 != (char *)0x0) {
                      pcVar23 = pSVar33->zAlias;
                      if (pcVar23 == (char *)0x0) {
                        pcVar23 = pTVar8->zName;
                      }
                      iVar15 = sqlite3StrICmp(pcVar23,pcVar31);
                      if (iVar15 != 0) goto LAB_00256246;
                    }
                    if (iVar13 == 0) {
                      local_e0 = pSVar33;
                    }
                    iVar13 = iVar13 + 1;
                    pCVar30 = pTVar8->aCol;
                    uVar29 = (uint)(ushort)pTVar8->nCol;
                    uVar37 = 0;
                    if (pTVar8->nCol < 1) {
                      uVar29 = 0;
                    }
                    for (; uVar37 != uVar29; uVar37 = uVar37 + 1) {
                      iVar15 = sqlite3StrICmp(pCVar30->zName,pcVar24);
                      if (iVar15 == 0) {
                        if (iVar14 != 1) {
LAB_00256205:
                          iVar14 = iVar14 + 1;
                          if (uVar37 == (int)pTVar8->iPKey) {
                            uVar37 = 0xffff;
                          }
                          pExpr->iColumn = (ynVar)uVar37;
                          local_e0 = pSVar33;
                          break;
                        }
                        if (((pSVar33->fg).jointype & 4) == 0) {
                          pIVar9 = pSVar33->pUsing;
                          if (pIVar9 == (IdList *)0x0) goto LAB_00256205;
                          uVar38 = pIVar9->nId;
                          if (pIVar9->nId < 1) {
                            uVar38 = 0;
                          }
                          lVar22 = 0;
                          do {
                            if ((ulong)uVar38 * 0x10 + 0x10 == lVar22 + 0x10) goto LAB_00256205;
                            iVar15 = sqlite3StrICmp(*(char **)((long)&pIVar9->a->zName + lVar22),
                                                    pcVar24);
                            lVar22 = lVar22 + 0x10;
                          } while (iVar15 != 0);
                        }
                      }
                      pCVar30 = pCVar30 + 1;
                    }
                  }
                }
                else {
                  uVar37 = pSVar4->pEList->nExpr;
                  uVar39 = 0;
                  uVar27 = (ulong)uVar37;
                  if ((int)uVar37 < 1) {
                    uVar27 = uVar39;
                  }
                  ppcVar35 = &pSVar4->pEList->a[0].zSpan;
                  bVar11 = false;
                  for (; uVar27 != uVar39; uVar39 = uVar39 + 1) {
                    iVar15 = sqlite3MatchSpanName(*ppcVar35,pcVar24,pcVar31,zRight);
                    if (iVar15 != 0) {
                      iVar14 = iVar14 + 1;
                      pExpr->iColumn = (ynVar)uVar39;
                      iVar13 = 2;
                      bVar11 = true;
                      local_e0 = pSVar33;
                    }
                    ppcVar35 = ppcVar35 + 4;
                  }
                  if (!bVar11 && pcVar31 != (char *)0x0) goto LAB_00256116;
                }
LAB_00256246:
                pSVar33 = pSVar33 + 1;
              }
              if (local_e0 == (SrcList_item *)0x0) {
                local_e0 = (SrcList_item *)0x0;
              }
              else {
                pExpr->iTable = local_e0->iCursor;
                pTVar8 = local_e0->pTab;
                pExpr->pTab = pTVar8;
                if (((local_e0->fg).jointype & 8) != 0) {
                  pbVar1 = (byte *)((long)&pExpr->flags + 2);
                  *pbVar1 = *pbVar1 | 0x10;
                }
                pSchema = pTVar8->pSchema;
              }
            }
            if (iVar13 == 0 && (pcVar31 != (char *)0x0 && zRight == (char *)0x0)) {
              pTVar8 = *ppTVar32;
              if (pTVar8 == (Table *)0x0) {
                iVar13 = 0;
              }
              else {
                uVar20 = pParse->eTriggerOp;
                if (uVar20 == 'm') {
LAB_002562fb:
                  iVar16 = sqlite3StrICmp("old",pcVar31);
                  iVar13 = 0;
                  iVar25 = 0;
                  if (iVar16 != 0) goto LAB_00256443;
                  bVar11 = true;
                }
                else {
                  iVar16 = sqlite3StrICmp("new",pcVar31);
                  iVar13 = 0;
                  if (iVar16 != 0) {
                    if (uVar20 == 'l') goto LAB_00256443;
                    goto LAB_002562fb;
                  }
                  bVar11 = false;
                  iVar25 = 1;
                }
                pExpr->iTable = iVar25;
                pCVar30 = pTVar8->aCol;
                pSchema = pTVar8->pSchema;
                uVar29 = (uint)pTVar8->nCol;
                uVar38 = 0;
                uVar37 = 0;
                if (0 < pTVar8->nCol) {
                  uVar37 = uVar29;
                }
                for (; uVar37 != uVar38; uVar38 = uVar38 + 1) {
                  iVar13 = sqlite3StrICmp(pCVar30->zName,pcVar24);
                  if (iVar13 == 0) {
                    uVar37 = uVar38;
                    if ((int)pTVar8->iPKey == uVar38) {
                      uVar37 = 0xffffffff;
                    }
                    if ((int)uVar37 < (int)uVar29) goto LAB_002563b2;
                    break;
                  }
                  pCVar30 = pCVar30 + 1;
                }
                iVar13 = sqlite3IsRowid(pcVar24);
                if (iVar13 != 0) {
                  uVar37 = uVar37 | -(uint)((pTVar8->tabFlags & 0x40) == 0);
                }
LAB_002563b2:
                if ((int)uVar37 < (int)uVar29) {
                  if ((int)uVar37 < 0) {
                    pExpr->affinity = 'D';
                  }
                  else {
                    uVar29 = 1 << ((byte)uVar37 & 0x1f);
                    if (0x1f < uVar37) {
                      uVar29 = 0xffffffff;
                    }
                    if (bVar11) {
                      pParse->oldmask = pParse->oldmask | uVar29;
                    }
                    else {
                      pParse->newmask = pParse->newmask | uVar29;
                    }
                  }
                  iVar14 = iVar14 + 1;
                  pExpr->iColumn = (ynVar)uVar37;
                  pExpr->pTab = pTVar8;
                  bVar12 = true;
                  iVar13 = 1;
                }
                else {
                  iVar13 = 1;
                }
              }
            }
LAB_00256443:
            if (((((iVar14 == 0) && (iVar13 == 1)) && (local_e0 != (SrcList_item *)0x0)) &&
                ((iVar14 = 0, (local_c0->ncFlags & 0x20) == 0 &&
                 (iVar16 = sqlite3IsRowid(pcVar24), iVar16 != 0)))) &&
               ((local_e0->pTab->tabFlags & 0x40) == 0)) {
              pExpr->iColumn = -1;
              pExpr->affinity = 'D';
              iVar14 = 1;
            }
            if (((pcVar31 == (char *)0x0) && (iVar14 == 0)) &&
               (pEList = local_c0->pEList, pEList != (ExprList *)0x0)) {
              uVar37 = pEList->nExpr;
              if (pEList->nExpr < 1) {
                uVar37 = 0;
              }
              ppcVar35 = &pEList->a[0].zName;
              for (uVar27 = 0; uVar37 != uVar27; uVar27 = uVar27 + 1) {
                pcVar23 = *ppcVar35;
                if ((pcVar23 != (char *)0x0) &&
                   (iVar14 = sqlite3StrICmp(pcVar23,pcVar24), iVar14 == 0)) {
                  if (((local_c0->ncFlags & 1) == 0) &&
                     ((((ExprList_item *)(ppcVar35 + -1))->pExpr->flags & 2) != 0)) {
                    sqlite3ErrorMsg(pParse,"misuse of aliased aggregate %s",pcVar23);
                    return 2;
                  }
                  iVar13 = sqlite3ExprVectorSize(((ExprList_item *)(ppcVar35 + -1))->pExpr);
                  if (iVar13 != 1) {
                    sqlite3ErrorMsg(pParse,"row value misused");
                    return 2;
                  }
                  resolveAlias(pParse,pEList,(int)uVar27,pExpr,"",local_98);
                  uVar37 = pExpr->flags;
                  goto LAB_002569ad;
                }
                ppcVar35 = ppcVar35 + 4;
              }
            }
            else if (iVar14 != 0) {
              if (iVar14 == 1) {
                bVar11 = true;
                goto LAB_00256934;
              }
              pcVar23 = "ambiguous column name";
              goto LAB_00256818;
            }
            local_c0 = local_c0->pNext;
            local_98 = local_98 + 1;
          } while (local_c0 != (NameContext *)0x0);
          pcVar23 = "no such column";
          if ((pcVar31 == (char *)0x0) && ((pExpr->flags & 0x40) != 0)) {
            pExpr->op = 'a';
            pExpr->pTab = (Table *)0x0;
            return 1;
          }
          local_c0 = (NameContext *)0x0;
LAB_00256818:
          if (zRight == (char *)0x0) {
            if (pcVar31 == (char *)0x0) {
              sqlite3ErrorMsg(pParse,"%s: %s",pcVar23,pcVar24);
            }
            else {
              sqlite3ErrorMsg(pParse,"%s: %s.%s",pcVar23,pcVar31,pcVar24);
            }
          }
          else {
            sqlite3ErrorMsg(pParse,"%s: %s.%s.%s",pcVar23,zRight,pcVar31,pcVar24);
          }
          pParse->checkSchema = '\x01';
          pNC->nErr = pNC->nErr + 1;
          bVar11 = false;
LAB_00256934:
          uVar3 = pExpr->iColumn;
          if ((-1 < (short)uVar3) && (local_e0 != (SrcList_item *)0x0)) {
            bVar19 = 0x3f;
            if (uVar3 < 0x3f) {
              bVar19 = (byte)uVar3;
            }
            local_e0->colUsed = local_e0->colUsed | 1L << (bVar19 & 0x3f);
          }
          sqlite3ExprDelete(psVar5,pExpr->pLeft);
          pExpr->pLeft = (Expr *)0x0;
          sqlite3ExprDelete(psVar5,pExpr->pRight);
          pExpr->pRight = (Expr *)0x0;
          uVar20 = '=';
          if (!bVar12) {
            uVar20 = 0x98;
          }
          pExpr->op = uVar20;
          uVar37 = pExpr->flags | 0x800000;
          pExpr->flags = uVar37;
          if (!bVar11) {
            return 2;
          }
LAB_002569ad:
          if (((uVar37 >> 0x16 & 1) == 0) && (pParse->db->xAuth != (sqlite3_xauth)0x0)) {
            pSVar7 = local_c0->pSrcList;
            iVar13 = sqlite3SchemaToIndex(pParse->db,pSchema);
            if (-1 < iVar13) {
              if (pExpr->op != '=') {
                uVar37 = pSVar7->nSrc;
                uVar27 = 0;
                if (0 < (int)uVar37) {
                  uVar27 = (ulong)uVar37;
                }
                lVar22 = uVar27 + 1;
                ppTVar28 = (Table **)&pSVar7[-1].a[0].pSelect;
                do {
                  lVar22 = lVar22 + -1;
                  if (lVar22 == 0) goto LAB_00256a73;
                  ppTVar32 = ppTVar28 + 0xe;
                  pyVar2 = (yColCache *)((long)ppTVar28 + 0x94);
                  ppTVar28 = ppTVar32;
                } while (pExpr->iTable != pyVar2->iTable);
              }
              pTVar8 = *ppTVar32;
              if (pTVar8 != (Table *)0x0) {
                lVar22 = (long)pExpr->iColumn;
                if ((pExpr->iColumn < 0) && (lVar22 = (long)pTVar8->iPKey, lVar22 < 0)) {
                  pcVar24 = "ROWID";
                }
                else {
                  pcVar24 = pTVar8->aCol[lVar22].zName;
                }
                iVar13 = sqlite3AuthReadCol(pParse,(char *)pTVar8->zName,pcVar24,iVar13);
                if (iVar13 == 2) {
                  pExpr->op = 'e';
                }
              }
            }
          }
LAB_00256a73:
          for (; pNC->nRef = pNC->nRef + 1, pNC != local_c0; pNC = pNC->pNext) {
          }
          return 1;
        }
        goto LAB_00255ef2;
      }
      goto LAB_00255d91;
    }
    pSVar4 = (pExpr->x).pSelect;
    if (pSVar4 == (Select *)0x0) {
      iVar13 = 0;
    }
    else {
      iVar13 = *(int *)&pSVar4->pEList;
    }
    psVar5 = pParse->db;
    uVar20 = psVar5->enc;
    pcVar24 = (pExpr->u).zToken;
    iVar14 = sqlite3Strlen30(pcVar24);
    pFVar18 = sqlite3FindFunction(psVar5,pcVar24,iVar13,uVar20,'\0');
    if (pFVar18 == (FuncDef *)0x0) {
      pFVar18 = sqlite3FindFunction(pParse->db,pcVar24,-2,uVar20,'\0');
      if (pFVar18 == (FuncDef *)0x0) {
        if ((pParse->db->init).busy != '\0') goto LAB_002567f5;
        pcVar31 = "no such function: %.*s";
      }
      else {
        pcVar31 = "wrong number of arguments to function %.*s()";
      }
    }
    else {
      p_Var10 = pFVar18->xFinalize;
      if ((pFVar18->funcFlags & 0x400) != 0) {
        pExpr->flags = pExpr->flags | 0x41000;
        if (iVar13 == 2) {
          w.pParse = (Parse *)0xbff0000000000000;
          if (pSVar4->pWhere->op == 0x84) {
            pcVar31 = (pSVar4->pWhere->u).zToken;
            iVar13 = sqlite3Strlen30(pcVar31);
            sqlite3AtoF(pcVar31,(double *)&w,iVar13,'\x01');
            if (1.0 < (double)w.pParse) goto LAB_0025669a;
            pExpr->iTable = (int)((double)w.pParse * 134217728.0);
            if (-1 < (int)((double)w.pParse * 134217728.0)) goto LAB_00256727;
          }
          else {
LAB_0025669a:
            pExpr->iTable = -1;
          }
          sqlite3ErrorMsg(pParse,
                          "second argument to likelihood() must be a constant between 0.0 and 1.0");
          pNC->nErr = pNC->nErr + 1;
        }
        else {
          iVar13 = 0x7800000;
          if (*pFVar18->zName == 'u') {
            iVar13 = 0x800000;
          }
          pExpr->iTable = iVar13;
        }
      }
LAB_00256727:
      iVar13 = sqlite3AuthCheck(pParse,0x1f,(char *)0x0,pFVar18->zName,(char *)0x0);
      if (iVar13 != 0) {
        if (iVar13 == 1) {
          sqlite3ErrorMsg(pParse,"not authorized to use function: %s",pFVar18->zName);
          pNC->nErr = pNC->nErr + 1;
        }
        pExpr->op = 'e';
        return 1;
      }
      uVar3 = pFVar18->funcFlags;
      if ((uVar3 & 0x2800) != 0) {
        pbVar1 = (byte *)((long)&pExpr->flags + 2);
        *pbVar1 = *pbVar1 | 8;
      }
      if ((uVar3 >> 0xb & 1) == 0) {
        notValid(pParse,pNC,"non-deterministic functions",0x22);
      }
      if (p_Var10 == (_func_void_sqlite3_context_ptr *)0x0) goto LAB_002567f5;
      if ((pNC->ncFlags & 1) != 0) {
        pNC->ncFlags = pNC->ncFlags & 0xfffe;
        sqlite3WalkExprList(pWalker,(ExprList *)pSVar4);
        pExpr->op = 0x99;
        pExpr->op2 = '\0';
        pNVar36 = pNC;
        do {
          if (pNVar36 == (NameContext *)0x0) {
LAB_00256ac9:
            *(byte *)&pNC->ncFlags = (byte)pNC->ncFlags | 1;
            return 1;
          }
          local_70 = pNVar36->pSrcList;
          w.xExprCallback = exprSrcCount;
          w.xSelectCallback = (_func_int_Walker_ptr_Select_ptr *)0x0;
          local_68 = 0;
          w.u.pNC = (NameContext *)&local_70;
          sqlite3WalkExprList(&w,(pExpr->x).pList);
          if ((0 < (int)local_68) || (local_68._4_4_ == 0)) {
            pNVar36->ncFlags = pFVar18->funcFlags & 0x1000 | pNVar36->ncFlags | 0x10;
            goto LAB_00256ac9;
          }
          pExpr->op2 = pExpr->op2 + '\x01';
          pNVar36 = pNVar36->pNext;
        } while( true );
      }
      pcVar31 = "misuse of aggregate function %.*s()";
    }
    sqlite3ErrorMsg(pParse,pcVar31,iVar14,pcVar24);
    pNC->nErr = pNC->nErr + 1;
LAB_002567f5:
    sqlite3WalkExprList(pWalker,(ExprList *)pSVar4);
    return 1;
  }
  if ((0x7e30000000000000U >> (uVar27 & 0x3f) & 1) == 0) {
    if ((0x40000000000001U >> (uVar27 & 0x3f) & 1) == 0) {
      if (uVar27 == 7) {
        pEVar17 = pExpr;
        zRight = (char *)0x0;
        pcVar31 = (char *)0x0;
        goto LAB_00255f50;
      }
      goto LAB_00255dfc;
    }
    goto LAB_00255e60;
  }
LAB_00255d91:
  if (pParse->db->mallocFailed != '\0') goto LAB_00255ef2;
  iVar13 = sqlite3ExprVectorSize(pExpr->pLeft);
  if (bVar19 == 0x49) {
    pSVar4 = (pExpr->x).pSelect;
    iVar14 = sqlite3ExprVectorSize(*(Expr **)&pSVar4->op);
    if (iVar14 == iVar13) {
      ppEVar34 = &pSVar4->pWhere;
      goto LAB_00255ebe;
    }
  }
  else {
    ppEVar34 = &pExpr->pRight;
LAB_00255ebe:
    iVar14 = sqlite3ExprVectorSize(*ppEVar34);
  }
  if (iVar13 != iVar14) {
    sqlite3ErrorMsg(pParse,"row value misused");
  }
LAB_00255ef2:
  if (pParse->nErr != 0) {
    return 2;
  }
  return (uint)(pParse->db->mallocFailed != '\0') * 2;
}

Assistant:

static int resolveExprStep(Walker *pWalker, Expr *pExpr){
  NameContext *pNC;
  Parse *pParse;

  pNC = pWalker->u.pNC;
  assert( pNC!=0 );
  pParse = pNC->pParse;
  assert( pParse==pWalker->pParse );

#ifndef NDEBUG
  if( pNC->pSrcList && pNC->pSrcList->nAlloc>0 ){
    SrcList *pSrcList = pNC->pSrcList;
    int i;
    for(i=0; i<pNC->pSrcList->nSrc; i++){
      assert( pSrcList->a[i].iCursor>=0 && pSrcList->a[i].iCursor<pParse->nTab);
    }
  }
#endif
  switch( pExpr->op ){

#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT) && !defined(SQLITE_OMIT_SUBQUERY)
    /* The special operator TK_ROW means use the rowid for the first
    ** column in the FROM clause.  This is used by the LIMIT and ORDER BY
    ** clause processing on UPDATE and DELETE statements.
    */
    case TK_ROW: {
      SrcList *pSrcList = pNC->pSrcList;
      struct SrcList_item *pItem;
      assert( pSrcList && pSrcList->nSrc==1 );
      pItem = pSrcList->a; 
      pExpr->op = TK_COLUMN;
      pExpr->pTab = pItem->pTab;
      pExpr->iTable = pItem->iCursor;
      pExpr->iColumn = -1;
      pExpr->affinity = SQLITE_AFF_INTEGER;
      break;
    }
#endif /* defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
          && !defined(SQLITE_OMIT_SUBQUERY) */

    /* A column name:                    ID
    ** Or table name and column name:    ID.ID
    ** Or a database, table and column:  ID.ID.ID
    **
    ** The TK_ID and TK_OUT cases are combined so that there will only
    ** be one call to lookupName().  Then the compiler will in-line 
    ** lookupName() for a size reduction and performance increase.
    */
    case TK_ID:
    case TK_DOT: {
      const char *zColumn;
      const char *zTable;
      const char *zDb;
      Expr *pRight;

      if( pExpr->op==TK_ID ){
        zDb = 0;
        zTable = 0;
        zColumn = pExpr->u.zToken;
      }else{
        notValid(pParse, pNC, "the \".\" operator", NC_IdxExpr);
        pRight = pExpr->pRight;
        if( pRight->op==TK_ID ){
          zDb = 0;
          zTable = pExpr->pLeft->u.zToken;
          zColumn = pRight->u.zToken;
        }else{
          assert( pRight->op==TK_DOT );
          zDb = pExpr->pLeft->u.zToken;
          zTable = pRight->pLeft->u.zToken;
          zColumn = pRight->pRight->u.zToken;
        }
      }
      return lookupName(pParse, zDb, zTable, zColumn, pNC, pExpr);
    }

    /* Resolve function names
    */
    case TK_FUNCTION: {
      ExprList *pList = pExpr->x.pList;    /* The argument list */
      int n = pList ? pList->nExpr : 0;    /* Number of arguments */
      int no_such_func = 0;       /* True if no such function exists */
      int wrong_num_args = 0;     /* True if wrong number of arguments */
      int is_agg = 0;             /* True if is an aggregate function */
      int nId;                    /* Number of characters in function name */
      const char *zId;            /* The function name. */
      FuncDef *pDef;              /* Information about the function */
      u8 enc = ENC(pParse->db);   /* The database encoding */

      assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
      zId = pExpr->u.zToken;
      nId = sqlite3Strlen30(zId);
      pDef = sqlite3FindFunction(pParse->db, zId, n, enc, 0);
      if( pDef==0 ){
        pDef = sqlite3FindFunction(pParse->db, zId, -2, enc, 0);
        if( pDef==0 ){
          no_such_func = 1;
        }else{
          wrong_num_args = 1;
        }
      }else{
        is_agg = pDef->xFinalize!=0;
        if( pDef->funcFlags & SQLITE_FUNC_UNLIKELY ){
          ExprSetProperty(pExpr, EP_Unlikely|EP_Skip);
          if( n==2 ){
            pExpr->iTable = exprProbability(pList->a[1].pExpr);
            if( pExpr->iTable<0 ){
              sqlite3ErrorMsg(pParse,
                "second argument to likelihood() must be a "
                "constant between 0.0 and 1.0");
              pNC->nErr++;
            }
          }else{
            /* EVIDENCE-OF: R-61304-29449 The unlikely(X) function is
            ** equivalent to likelihood(X, 0.0625).
            ** EVIDENCE-OF: R-01283-11636 The unlikely(X) function is
            ** short-hand for likelihood(X,0.0625).
            ** EVIDENCE-OF: R-36850-34127 The likely(X) function is short-hand
            ** for likelihood(X,0.9375).
            ** EVIDENCE-OF: R-53436-40973 The likely(X) function is equivalent
            ** to likelihood(X,0.9375). */
            /* TUNING: unlikely() probability is 0.0625.  likely() is 0.9375 */
            pExpr->iTable = pDef->zName[0]=='u' ? 8388608 : 125829120;
          }             
        }
#ifndef SQLITE_OMIT_AUTHORIZATION
        {
          int auth = sqlite3AuthCheck(pParse, SQLITE_FUNCTION, 0,pDef->zName,0);
          if( auth!=SQLITE_OK ){
            if( auth==SQLITE_DENY ){
              sqlite3ErrorMsg(pParse, "not authorized to use function: %s",
                                      pDef->zName);
              pNC->nErr++;
            }
            pExpr->op = TK_NULL;
            return WRC_Prune;
          }
        }
#endif
        if( pDef->funcFlags & (SQLITE_FUNC_CONSTANT|SQLITE_FUNC_SLOCHNG) ){
          /* For the purposes of the EP_ConstFunc flag, date and time
          ** functions and other functions that change slowly are considered
          ** constant because they are constant for the duration of one query */
          ExprSetProperty(pExpr,EP_ConstFunc);
        }
        if( (pDef->funcFlags & SQLITE_FUNC_CONSTANT)==0 ){
          /* Date/time functions that use 'now', and other functions like
          ** sqlite_version() that might change over time cannot be used
          ** in an index. */
          notValid(pParse, pNC, "non-deterministic functions",
                   NC_IdxExpr|NC_PartIdx);
        }
      }
      if( is_agg && (pNC->ncFlags & NC_AllowAgg)==0 ){
        sqlite3ErrorMsg(pParse, "misuse of aggregate function %.*s()", nId,zId);
        pNC->nErr++;
        is_agg = 0;
      }else if( no_such_func && pParse->db->init.busy==0
#ifdef SQLITE_ENABLE_UNKNOWN_SQL_FUNCTION
                && pParse->explain==0
#endif
      ){
        sqlite3ErrorMsg(pParse, "no such function: %.*s", nId, zId);
        pNC->nErr++;
      }else if( wrong_num_args ){
        sqlite3ErrorMsg(pParse,"wrong number of arguments to function %.*s()",
             nId, zId);
        pNC->nErr++;
      }
      if( is_agg ) pNC->ncFlags &= ~NC_AllowAgg;
      sqlite3WalkExprList(pWalker, pList);
      if( is_agg ){
        NameContext *pNC2 = pNC;
        pExpr->op = TK_AGG_FUNCTION;
        pExpr->op2 = 0;
        while( pNC2 && !sqlite3FunctionUsesThisSrc(pExpr, pNC2->pSrcList) ){
          pExpr->op2++;
          pNC2 = pNC2->pNext;
        }
        assert( pDef!=0 );
        if( pNC2 ){
          assert( SQLITE_FUNC_MINMAX==NC_MinMaxAgg );
          testcase( (pDef->funcFlags & SQLITE_FUNC_MINMAX)!=0 );
          pNC2->ncFlags |= NC_HasAgg | (pDef->funcFlags & SQLITE_FUNC_MINMAX);

        }
        pNC->ncFlags |= NC_AllowAgg;
      }
      /* FIX ME:  Compute pExpr->affinity based on the expected return
      ** type of the function 
      */
      return WRC_Prune;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT:
    case TK_EXISTS:  testcase( pExpr->op==TK_EXISTS );
#endif
    case TK_IN: {
      testcase( pExpr->op==TK_IN );
      if( ExprHasProperty(pExpr, EP_xIsSelect) ){
        int nRef = pNC->nRef;
        notValid(pParse, pNC, "subqueries", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
        sqlite3WalkSelect(pWalker, pExpr->x.pSelect);
        assert( pNC->nRef>=nRef );
        if( nRef!=pNC->nRef ){
          ExprSetProperty(pExpr, EP_VarSelect);
          pNC->ncFlags |= NC_VarSelect;
        }
      }
      break;
    }
    case TK_VARIABLE: {
      notValid(pParse, pNC, "parameters", NC_IsCheck|NC_PartIdx|NC_IdxExpr);
      break;
    }
    case TK_BETWEEN:
    case TK_EQ:
    case TK_NE:
    case TK_LT:
    case TK_LE:
    case TK_GT:
    case TK_GE:
    case TK_IS:
    case TK_ISNOT: {
      int nLeft, nRight;
      if( pParse->db->mallocFailed ) break;
      assert( pExpr->pLeft!=0 );
      nLeft = sqlite3ExprVectorSize(pExpr->pLeft);
      if( pExpr->op==TK_BETWEEN ){
        nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[0].pExpr);
        if( nRight==nLeft ){
          nRight = sqlite3ExprVectorSize(pExpr->x.pList->a[1].pExpr);
        }
      }else{
        assert( pExpr->pRight!=0 );
        nRight = sqlite3ExprVectorSize(pExpr->pRight);
      }
      if( nLeft!=nRight ){
        testcase( pExpr->op==TK_EQ );
        testcase( pExpr->op==TK_NE );
        testcase( pExpr->op==TK_LT );
        testcase( pExpr->op==TK_LE );
        testcase( pExpr->op==TK_GT );
        testcase( pExpr->op==TK_GE );
        testcase( pExpr->op==TK_IS );
        testcase( pExpr->op==TK_ISNOT );
        testcase( pExpr->op==TK_BETWEEN );
        sqlite3ErrorMsg(pParse, "row value misused");
      }
      break; 
    }
  }
  return (pParse->nErr || pParse->db->mallocFailed) ? WRC_Abort : WRC_Continue;
}